

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

void __thiscall FBlockLinesIterator::StartBlock(FBlockLinesIterator *this,int x,int y)

{
  uint uVar1;
  long lVar2;
  int *piVar3;
  polyblock_t *ppVar4;
  
  this->curx = x;
  this->cury = y;
  if ((((y | x) < 0) || (bmapwidth <= x)) || (bmapheight <= y)) {
    this->list = (int *)0x0;
    lVar2 = 0x18;
    piVar3 = (int *)0x0;
  }
  else {
    uVar1 = bmapwidth * y + x;
    if (PolyBlockMap == (polyblock_t **)0x0) {
      ppVar4 = (polyblock_t *)0x0;
    }
    else {
      ppVar4 = PolyBlockMap[uVar1];
    }
    this->polyLink = ppVar4;
    this->polyIndex = 0;
    piVar3 = blockmaplump + (long)blockmap[uVar1] + 1;
    lVar2 = 0x28;
  }
  *(int **)((long)&this->minx + lVar2) = piVar3;
  return;
}

Assistant:

void FBlockLinesIterator::StartBlock(int x, int y) 
{ 
	curx = x; 
	cury = y; 
	if (x >= 0 && y >= 0 && x < bmapwidth && y <bmapheight)
	{
		int offset = y*bmapwidth + x;
		polyLink = PolyBlockMap? PolyBlockMap[offset] : NULL;
		polyIndex = 0;

		// There is an extra entry at the beginning of every block.
		// Apparently, id had originally intended for it to be used
		// to keep track of things, but the final code does not do that.
		list = blockmaplump + *(blockmap + offset) + 1;
	}
	else
	{
		// invalid block
		list = NULL;
		polyLink = NULL;
	}
}